

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigParser.cpp
# Opt level: O2

void __thiscall ConfigParser::ProcessConfiguration(ConfigParser *this,HANDLE hmod)

{
  bool bVar1;
  bool bVar2;
  MemoryLogger *logger;
  StackTraceHelper *helper;
  ConfigParser *this_00;
  WCHAR local_228 [4];
  char16 modulename [260];
  
  GetModuleFileNameW(hmod,local_228,0x104);
  this_00 = (ConfigParser *)&Js::Configuration::Global;
  bVar1 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,OutputFileFlag);
  if ((bVar1) && (DAT_0144aa90 != (WCHAR *)0x0)) {
    SetOutputFile(this_00,DAT_0144aa90,DAT_0144aa98);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  if (DAT_01433308 == '\x01') {
    Output::s_useDebuggerWindow = true;
    bVar1 = true;
  }
  if (DAT_0144aaa0 == '\x01') {
    logger = Js::MemoryLogger::Create(&s_arenaHost1.m_allocator,DAT_0144aaa4 * 3);
    Output::SetInMemoryLogger(&logger->super_ILogger);
    bVar1 = true;
  }
  if (DAT_0144aaa8 == '\x01') {
    helper = Js::StackTraceHelper::Create(&s_arenaHost2.m_allocator);
    Output::SetStackTraceHelper(&helper->super_IStackTraceHelper);
  }
  if (bVar1) {
    ConfigParserAPI::DisplayInitialOutput(local_228);
    Output::Print(L"\n");
    Js::ConfigFlagsTable::VerboseDump((ConfigFlagsTable *)&Js::Configuration::Global);
    Output::Flush();
  }
  if (DAT_0143bfcb == '\x01') {
    DAT_0143bff0 = 1;
    DAT_01436200 = 1;
  }
  Memory::ForcedMemoryConstraint::Apply();
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_0143ef20,AllPhase);
  if (bVar1) {
    Memory::RecyclerMemoryTracking::Activate();
LAB_00355ee6:
    Memory::PageTracking::Activate();
    if (bVar1) goto LAB_00355f09;
  }
  else {
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_0143ef20,RecyclerPhase);
    if (bVar2) {
      Memory::RecyclerMemoryTracking::Activate();
    }
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_0143ef20,PageAllocatorPhase);
    if (bVar2) goto LAB_00355ee6;
  }
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_0143ef20,ArenaPhase);
  if (!bVar1) {
    return;
  }
LAB_00355f09:
  Memory::ArenaMemoryTracking::Activate();
  return;
}

Assistant:

void ConfigParser::ProcessConfiguration(HANDLE hmod)
{
#if defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    bool hasOutput = false;
    char16 modulename[_MAX_PATH];

    GetModuleFileName((HMODULE)hmod, modulename, _MAX_PATH);

    // Win32 specific console creation code
    // xplat-todo: Consider having this mechanism available on other
    // platforms
    // Not a pressing need since ChakraCore runs only in consoles by
    // default so we don't need to allocate a second console for this
#if CONFIG_CONSOLE_AVAILABLE
    if (Js::Configuration::Global.flags.Console)
    {
        int fd;
        FILE *fp;

        // fail usually means there is an existing console. We don't really care.
        if (AllocConsole())
        {
            fd = _open_osfhandle((intptr_t)GetStdHandle(STD_OUTPUT_HANDLE), O_TEXT);
            fp = _wfdopen(fd, _u("w"));

            if (fp != nullptr)
            {
                *stdout = *fp;                
                setvbuf(stdout, nullptr, _IONBF, 0);

                fd = _open_osfhandle((intptr_t)GetStdHandle(STD_ERROR_HANDLE), O_TEXT);
                fp = _wfdopen(fd, _u("w"));

                if (fp != nullptr)
                {
                    *stderr = *fp;
                    setvbuf(stderr, nullptr, _IONBF, 0);

                    char16 buffer[_MAX_PATH + 70];

                    if (ConfigParserAPI::FillConsoleTitle(buffer, _MAX_PATH + 20, modulename))
                    {
                        SetConsoleTitle(buffer);
                    }

                    hasOutput = true;
                }
            }
        }
    }
#endif

    if (Js::Configuration::Global.flags.IsEnabled(Js::OutputFileFlag)
        && Js::Configuration::Global.flags.OutputFile != nullptr)
    {
        SetOutputFile(Js::Configuration::Global.flags.OutputFile, Js::Configuration::Global.flags.OutputFileOpenMode);
        hasOutput = true;
    }

    if (Js::Configuration::Global.flags.DebugWindow)
    {
        Output::UseDebuggerWindow();
        hasOutput = true;
    }

#ifdef ENABLE_TRACE
    if (CONFIG_FLAG(InMemoryTrace))
    {
        Output::SetInMemoryLogger(
            Js::MemoryLogger::Create(::GetOutputAllocator1(),
            CONFIG_FLAG(InMemoryTraceBufferSize) * 3));   // With stack each trace is 3 entries (header, msg, stack).
        hasOutput = true;
    }

#ifdef STACK_BACK_TRACE
    if (CONFIG_FLAG(TraceWithStack))
    {
        Output::SetStackTraceHelper(Js::StackTraceHelper::Create(::GetOutputAllocator2()));
    }
#endif // STACK_BACK_TRACE
#endif // ENABLE_TRACE

    if (hasOutput)
    {
        ConfigParserAPI::DisplayInitialOutput(modulename);

        Output::Print(_u("\n"));

        Js::Configuration::Global.flags.VerboseDump();
        Output::Flush();
    }

    if (Js::Configuration::Global.flags.ForceSerialized)
    {
        // Can't generate or execute byte code under forced serialize
        Js::Configuration::Global.flags.GenerateByteCodeBufferReturnsCantGenerate = true;
        Js::Configuration::Global.flags.ExecuteByteCodeBufferReturnsInvalidByteCode = true;
    }

    ForcedMemoryConstraint::Apply();
#endif

#ifdef MEMSPECT_TRACKING
    bool all = false;
    if (Js::Configuration::Global.flags.Memspect.IsEnabled(Js::AllPhase))
    {
        all = true;
    }
    if (all || Js::Configuration::Global.flags.Memspect.IsEnabled(Js::RecyclerPhase))
    {
        RecyclerMemoryTracking::Activate();
    }
    if (all || Js::Configuration::Global.flags.Memspect.IsEnabled(Js::PageAllocatorPhase))
    {
        PageTracking::Activate();
    }
    if (all || Js::Configuration::Global.flags.Memspect.IsEnabled(Js::ArenaPhase))
    {
        ArenaMemoryTracking::Activate();
    }
#endif
}